

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS
ref_geom_bspline_bundle_tec(REF_INT degree,REF_INT n_control_point,REF_DBL *bundle,char *filename)

{
  size_t __size;
  double dVar1;
  REF_DBL *knots;
  REF_STATUS RVar2;
  FILE *__s;
  REF_DBL *control_points;
  REF_DBL *control_points_00;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  double t;
  REF_DBL uv [2];
  REF_DBL local_58;
  REF_DBL local_50 [2];
  REF_DBL *local_40;
  double local_38;
  
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar6 = "unable to open file";
    uVar5 = 0x114f;
  }
  else {
    fwrite("title=\"refine bspine bundle\"\n",0x1d,1,__s);
    fwrite("variables = \"u\" \"v\" \"t\"\n",0x18,1,__s);
    if (n_control_point < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1154
             ,"ref_geom_bspline_bundle_tec","malloc u of REF_DBL negative");
      return 1;
    }
    __size = (ulong)(uint)n_control_point * 8;
    control_points = (REF_DBL *)malloc(__size);
    if (control_points == (REF_DBL *)0x0) {
      pcVar6 = "malloc u of REF_DBL NULL";
      uVar5 = 0x1154;
    }
    else {
      control_points_00 = (REF_DBL *)malloc(__size);
      if (control_points_00 != (REF_DBL *)0x0) {
        lVar4 = (long)(degree + n_control_point);
        if (n_control_point != 0) {
          lVar3 = 0;
          do {
            *(undefined8 *)((long)control_points + lVar3) =
                 *(undefined8 *)((long)bundle + lVar3 * 2 + lVar4 * 8 + 8);
            *(undefined8 *)((long)control_points_00 + lVar3) =
                 *(undefined8 *)((long)bundle + lVar3 * 2 + lVar4 * 8 + 0x10);
            lVar3 = lVar3 + 8;
          } while ((ulong)(uint)n_control_point << 3 != lVar3);
        }
        iVar8 = 0;
        local_40 = bundle;
        fprintf(__s,"zone t=\"control\", i=%d, datapacking=%s\n",(ulong)(uint)n_control_point,
                "point");
        if (n_control_point != 0) {
          uVar9 = 1;
          if (1 < n_control_point) {
            uVar9 = (ulong)(uint)n_control_point;
          }
          uVar7 = 0;
          do {
            fprintf(__s,"%f %f %f\n",control_points[uVar7],control_points_00[uVar7],
                    (double)(int)uVar7 / (double)(n_control_point + -1));
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        fprintf(__s,"zone t=\"bundle\", i=%d, datapacking=%s\n",0x3e9,"point");
        knots = local_40;
        local_38 = *local_40;
        dVar1 = local_40[lVar4];
        do {
          t = ((double)iVar8 / 1000.0) * dVar1 + (1.0 - (double)iVar8 / 1000.0) * local_38;
          RVar2 = ref_geom_bspline_eval(degree,n_control_point,knots,t,control_points,&local_58);
          if (RVar2 != 0) {
            uVar5 = 0x116a;
LAB_001725d3:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar5,"ref_geom_bspline_bundle_tec",1,"eval");
            return 1;
          }
          RVar2 = ref_geom_bspline_eval(degree,n_control_point,knots,t,control_points_00,local_50);
          if (RVar2 != 0) {
            uVar5 = 0x116c;
            goto LAB_001725d3;
          }
          fprintf(__s,"%f %f %f\n",local_58,local_50[0],t);
          iVar8 = iVar8 + 1;
          if (iVar8 == 0x3e9) {
            free(control_points_00);
            free(control_points);
            fclose(__s);
            return 0;
          }
        } while( true );
      }
      pcVar6 = "malloc v of REF_DBL NULL";
      uVar5 = 0x1155;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar5,
         "ref_geom_bspline_bundle_tec",pcVar6);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bspline_bundle_tec(REF_INT degree,
                                               REF_INT n_control_point,
                                               REF_DBL *bundle,
                                               const char *filename) {
  REF_INT i, n = 1001;
  REF_DBL t, t0, t1, s0, s1;
  REF_DBL *u, *v, uv[2], *knots;
  REF_INT nknot = ref_geom_bspline_nknot(degree, n_control_point);
  FILE *file;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine bspine bundle\"\n");
  fprintf(file, "variables = \"u\" \"v\" \"t\"\n");

  ref_malloc(u, n_control_point, REF_DBL);
  ref_malloc(v, n_control_point, REF_DBL);
  knots = bundle;
  for (i = 0; i < n_control_point; i++) {
    u[i] = bundle[nknot + 0 + 2 * i];
    v[i] = bundle[nknot + 1 + 2 * i];
  }
  fprintf(file, "zone t=\"control\", i=%d, datapacking=%s\n", n_control_point,
          "point");
  for (i = 0; i < n_control_point; i++) {
    t = ((REF_DBL)i / ((REF_DBL)(n_control_point - 1)));
    fprintf(file, "%f %f %f\n", u[i], v[i], t);
  }

  fprintf(file, "zone t=\"bundle\", i=%d, datapacking=%s\n", n, "point");
  t0 = knots[0];
  t1 = knots[nknot - 1];
  for (i = 0; i < n; i++) {
    s1 = ((REF_DBL)i) / ((REF_DBL)(n - 1));
    s0 = 1.0 - s1;
    t = s0 * t0 + s1 * t1;
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, u, &(uv[0])),
        "eval");
    RSS(ref_geom_bspline_eval(degree, n_control_point, knots, t, v, &(uv[1])),
        "eval");
    fprintf(file, "%f %f %f\n", uv[0], uv[1], t);
  }
  ref_free(v);
  ref_free(u);
  fclose(file);
  return REF_SUCCESS;
}